

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFNumberTreeObjectHelper::iterator::insertAfter
          (iterator *this,numtree_number key,QPDFObjectHandle *value)

{
  NNTreeIterator *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _StackY_48;
  element_type *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffffc8);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_StackY_48,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
  NNTreeIterator::insertAfter
            (this_00,(QPDFObjectHandle *)&stack0xffffffffffffffc8,(QPDFObjectHandle *)&_StackY_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_StackY_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  updateIValue(this);
  return;
}

Assistant:

void
QPDFNumberTreeObjectHelper::iterator::insertAfter(numtree_number key, QPDFObjectHandle value)
{
    impl->insertAfter(QPDFObjectHandle::newInteger(key), value);
    updateIValue();
}